

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base_logger.cpp
# Opt level: O1

LogStreamParam * __thiscall
cppnet::BaseLogger::GetStreamParam
          (LogStreamParam *__return_storage_ptr__,BaseLogger *this,LogLevel level,char *file,
          uint32_t line)

{
  uint32_t uVar1;
  shared_ptr<cppnet::Log> log;
  _Any_data local_58;
  code *local_48;
  code *pcStack_40;
  element_type *local_38;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_30;
  
  if ((int)(uint)this->_level < (int)level) {
    (__return_storage_ptr__->second).super__Function_base._M_manager = (_Manager_type)0x0;
    (__return_storage_ptr__->second)._M_invoker = (_Invoker_type)0x0;
    *(undefined8 *)&(__return_storage_ptr__->second).super__Function_base._M_functor = 0;
    *(undefined8 *)((long)&(__return_storage_ptr__->second).super__Function_base._M_functor + 8) = 0
    ;
    (__return_storage_ptr__->first).super___shared_ptr<cppnet::Log,_(__gnu_cxx::_Lock_policy)2>.
    _M_ptr = (element_type *)0x0;
    (__return_storage_ptr__->first).super___shared_ptr<cppnet::Log,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    return __return_storage_ptr__;
  }
  GetLog((BaseLogger *)&stack0xffffffffffffffc8);
  local_48 = (code *)0x0;
  pcStack_40 = (code *)0x0;
  local_58._M_unused._M_object = (BaseLogger *)0x0;
  local_58._8_8_ = 0;
  switch(level) {
  case LL_NULL:
    goto switchD_00117aaf_caseD_0;
  case LL_FATAL:
    pcStack_40 = std::
                 _Function_handler<void_(std::shared_ptr<cppnet::Log>),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/caozhiyi[P]CppNet/common/log/base_logger.cpp:157:14)>
                 ::_M_invoke;
    local_48 = std::
               _Function_handler<void_(std::shared_ptr<cppnet::Log>),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/caozhiyi[P]CppNet/common/log/base_logger.cpp:157:14)>
               ::_M_manager;
    local_58._8_8_ = 0;
    local_58._M_unused._M_object = this;
    uVar1 = FormatLog(file,line,"FAT",local_38->_log,local_38->_len);
    break;
  case 2:
  case 4:
  case 5:
  case 6:
switchD_00117aaf_caseD_2:
    (__return_storage_ptr__->second).super__Function_base._M_manager = (_Manager_type)0x0;
    (__return_storage_ptr__->second)._M_invoker = (_Invoker_type)0x0;
    *(undefined8 *)&(__return_storage_ptr__->second).super__Function_base._M_functor = 0;
    *(undefined8 *)((long)&(__return_storage_ptr__->second).super__Function_base._M_functor + 8) = 0
    ;
    (__return_storage_ptr__->first).super___shared_ptr<cppnet::Log,_(__gnu_cxx::_Lock_policy)2>.
    _M_ptr = (element_type *)0x0;
    (__return_storage_ptr__->first).super___shared_ptr<cppnet::Log,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    goto LAB_00117d7b;
  case LL_ERROR:
    pcStack_40 = std::
                 _Function_handler<void_(std::shared_ptr<cppnet::Log>),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/caozhiyi[P]CppNet/common/log/base_logger.cpp:161:14)>
                 ::_M_invoke;
    local_48 = std::
               _Function_handler<void_(std::shared_ptr<cppnet::Log>),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/caozhiyi[P]CppNet/common/log/base_logger.cpp:161:14)>
               ::_M_manager;
    local_58._8_8_ = 0;
    local_58._M_unused._M_object = this;
    uVar1 = FormatLog(file,line,"ERR",local_38->_log,local_38->_len);
    break;
  case LL_WARN:
    pcStack_40 = std::
                 _Function_handler<void_(std::shared_ptr<cppnet::Log>),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/caozhiyi[P]CppNet/common/log/base_logger.cpp:165:14)>
                 ::_M_invoke;
    local_48 = std::
               _Function_handler<void_(std::shared_ptr<cppnet::Log>),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/caozhiyi[P]CppNet/common/log/base_logger.cpp:165:14)>
               ::_M_manager;
    local_58._8_8_ = 0;
    local_58._M_unused._M_object = this;
    uVar1 = FormatLog(file,line,"WAR",local_38->_log,local_38->_len);
    break;
  default:
    if (level == LL_INFO) {
      pcStack_40 = std::
                   _Function_handler<void_(std::shared_ptr<cppnet::Log>),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/caozhiyi[P]CppNet/common/log/base_logger.cpp:169:14)>
                   ::_M_invoke;
      local_48 = std::
                 _Function_handler<void_(std::shared_ptr<cppnet::Log>),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/caozhiyi[P]CppNet/common/log/base_logger.cpp:169:14)>
                 ::_M_manager;
      local_58._8_8_ = 0;
      local_58._M_unused._M_object = this;
      uVar1 = FormatLog(file,line,"INF",local_38->_log,local_38->_len);
    }
    else {
      if (level != LL_DEBUG) goto switchD_00117aaf_caseD_2;
      pcStack_40 = std::
                   _Function_handler<void_(std::shared_ptr<cppnet::Log>),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/caozhiyi[P]CppNet/common/log/base_logger.cpp:173:14)>
                   ::_M_invoke;
      local_48 = std::
                 _Function_handler<void_(std::shared_ptr<cppnet::Log>),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/caozhiyi[P]CppNet/common/log/base_logger.cpp:173:14)>
                 ::_M_manager;
      local_58._8_8_ = 0;
      local_58._M_unused._M_object = this;
      uVar1 = FormatLog(file,line,"DEB",local_38->_log,local_38->_len);
    }
  }
  local_38->_len = uVar1;
switchD_00117aaf_caseD_0:
  std::pair<std::shared_ptr<cppnet::Log>,_std::function<void_(std::shared_ptr<cppnet::Log>)>_>::
  pair<std::shared_ptr<cppnet::Log>_&,_std::function<void_(std::shared_ptr<cppnet::Log>)>_&,_true>
            (__return_storage_ptr__,(shared_ptr<cppnet::Log> *)&stack0xffffffffffffffc8,
             (function<void_(std::shared_ptr<cppnet::Log>)> *)&local_58);
LAB_00117d7b:
  if (local_48 != (code *)0x0) {
    (*local_48)(&local_58,&local_58,__destroy_functor);
  }
  if (local_30._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_30._M_pi);
  }
  return __return_storage_ptr__;
}

Assistant:

LogStreamParam BaseLogger::GetStreamParam(LogLevel level, const char* file, uint32_t line) {
    // check log level can print
    if (level > _level) {
        return std::make_pair(nullptr, nullptr);
    }

    std::shared_ptr<Log> log = GetLog();
    std::function<void(std::shared_ptr<Log>)> cb;
    switch (level)
    {
    case LL_NULL:
        break;
    case LL_FATAL:
        cb = [this](std::shared_ptr<Log> l) { _logger->Fatal(l); };
        log->_len = FormatLog(file, line, "FAT", log->_log, log->_len);
        break;
    case LL_ERROR:
        cb = [this](std::shared_ptr<Log> l) { _logger->Error(l); };
        log->_len = FormatLog(file, line, "ERR", log->_log, log->_len);
        break;
    case LL_WARN:
        cb = [this](std::shared_ptr<Log> l) { _logger->Warn(l); };
        log->_len = FormatLog(file, line, "WAR", log->_log, log->_len);
        break;
    case LL_INFO:
        cb = [this](std::shared_ptr<Log> l) { _logger->Info(l); };
        log->_len = FormatLog(file, line, "INF", log->_log, log->_len);
        break;
    case LL_DEBUG:
        cb = [this](std::shared_ptr<Log> l) { _logger->Debug(l); };
        log->_len = FormatLog(file, line, "DEB", log->_log, log->_len);
        break;
    default:
        return std::make_pair(nullptr, nullptr);
    }

    return std::make_pair(log, cb);
}